

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O0

void utest_utils_utils_extract_base_path(int *utest_result,size_t utest_index)

{
  size_t utest_index_local;
  int *utest_result_local;
  
  utest_run_utils_utils_extract_base_path(utest_result);
  return;
}

Assistant:

UTEST(utils, utils_extract_base_path) {
    T(ExtractBasePath("/path/to/file.txt") == "/path/to");
    T(ExtractBasePath("/path/to/another.file.docx") == "/path/to");
    T(ExtractBasePath("example") == "");
    T(ExtractBasePath("example.txt") == "");
    T(ExtractBasePath("./filename.txt") == ".");
    T(ExtractBasePath("path/with/no/extension/") == "path/with/no/extension");
    T(ExtractBasePath("") == "");
}